

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acmod_set.c
# Opt level: O2

char * acmod_set_id2fullname(acmod_set_t *acmod_set,acmod_id_t id)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  word_posn_t posn;
  acmod_id_t right;
  acmod_id_t left;
  acmod_id_t base;
  word_posn_t local_38;
  acmod_id_t local_34;
  acmod_id_t local_30;
  acmod_id_t local_2c;
  
  if (id < acmod_set->n_ci) {
    pcVar4 = acmod_set_id2fullname::str;
    sprintf(acmod_set_id2fullname::str,"%s - - -",acmod_set->ci[id].name);
  }
  else if (id < acmod_set->next_id) {
    acmod_set_id2tri(acmod_set,&local_2c,&local_30,&local_34,&local_38,id);
    pcVar1 = acmod_set_id2name(acmod_set,local_2c);
    pcVar2 = acmod_set_id2name(acmod_set,local_30);
    pcVar3 = acmod_set_id2name(acmod_set,local_34);
    pcVar4 = acmod_set_id2fullname::str;
    sprintf(acmod_set_id2fullname::str,"%s %s %s %c",pcVar1,pcVar2,pcVar3,
            (ulong)(uint)(int)"besiu"[(int)local_38]);
  }
  else {
    pcVar4 = (char *)0x0;
  }
  return pcVar4;
}

Assistant:

const char *
acmod_set_id2fullname(acmod_set_t *acmod_set,
		      acmod_id_t id)
{
    static char str[1024];
    char *pmap = WORD_POSN_CHAR_MAP;
    acmod_id_t base;
    acmod_id_t left;
    acmod_id_t right;
    word_posn_t posn;

    if (id < acmod_set->n_ci) {
	sprintf(str, "%s - - -", acmod_set->ci[id].name);

	return str;
    }
    else if (id < acmod_set->next_id) {

	acmod_set_id2tri(acmod_set, &base, &left, &right, &posn, id);

	sprintf(str, "%s %s %s %c",
		acmod_set_id2name(acmod_set, base),
		acmod_set_id2name(acmod_set, left),
		acmod_set_id2name(acmod_set, right),
		pmap[(int)posn]);
	
	return str;
    }
    else
	return NULL;
}